

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O3

bool __thiscall
llvm::DWARFExpression::Operation::print
          (Operation *this,raw_ostream *OS,DWARFExpression *Expr,MCRegisterInfo *RegInfo,
          DWARFUnit *U,bool isEH)

{
  bool bVar1;
  byte bVar2;
  Encoding EVar3;
  DWARFAbbreviationDeclaration *pDVar4;
  char *pcVar5;
  uint8_t uVar6;
  Optional<unsigned_int> OVar7;
  raw_ostream *OS_00;
  size_t sVar8;
  void *__buf;
  uint uVar9;
  char *__s;
  uint uVar10;
  DWARFUnit *this_00;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  StringRef Str;
  StringRef Str_00;
  StringRef SVar14;
  Optional<const_char_*> OVar15;
  undefined1 local_a0 [8];
  DWARFDie Die;
  undefined1 local_88 [8];
  Optional<llvm::DWARFFormValue> Name;
  
  bVar1 = this->Error;
  Die.Die = (DWARFDebugInfoEntry *)U;
  if (bVar1 == true) {
    __s = "<decoding error>";
    sVar8 = 0x10;
LAB_00d72c80:
    Str.Length = sVar8;
    Str.Data = __s;
    raw_ostream::operator<<(OS,Str);
  }
  else {
    SVar14 = dwarf::OperationEncodingString((uint)this->Opcode);
    if (SVar14.Length == 0) {
      __assert_fail("!Name.empty() && \"DW_OP has no name!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                    ,0xf8,
                    "bool llvm::DWARFExpression::Operation::print(raw_ostream &, const DWARFExpression *, const MCRegisterInfo *, DWARFUnit *, bool)"
                   );
    }
    raw_ostream::operator<<(OS,SVar14);
    bVar2 = this->Opcode;
    if ((((byte)(bVar2 + 0xb0) < 0x40) || ((bVar2 | 2) == 0x92)) &&
       (RegInfo != (MCRegisterInfo *)0x0)) {
      if ((bVar2 | 2) == 0x92) {
        uVar9 = (uint)this->Operands[0];
        lVar12 = 1;
      }
      else {
        if ((byte)(bVar2 + 0x90) < 0x22) {
          uVar9 = bVar2 - 0x70;
        }
        else {
          uVar9 = bVar2 - 0x50;
        }
        lVar12 = 0;
      }
      OVar7 = MCRegisterInfo::getLLVMRegNum(RegInfo,uVar9,isEH);
      if (((ulong)OVar7.Storage & 0x100000000) != 0) {
        if (RegInfo->NumRegs <= OVar7.Storage.field_0.value) {
          __assert_fail("RegNo < NumRegs && \"Attempting to access record for invalid register number!\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/MC/MCRegisterInfo.h"
                        ,0x14b,
                        "const MCRegisterDesc &llvm::MCRegisterInfo::operator[](MCRegister) const");
        }
        if (RegInfo->RegStrings != (char *)0x0) {
          __s = RegInfo->RegStrings + RegInfo->Desc[(ulong)OVar7.Storage & 0xffffffff].Name;
          bVar13 = 0x1f < (byte)(bVar2 - 0x70);
          if (bVar2 == 0x92 || !bVar13) {
            Name.Storage.field_0._0_8_ = anon_var_dwarf_41e9383;
            local_88 = (undefined1  [8])&PTR_home_010782d8;
            Name.Storage.field_0.value.Value.field_0 =
                 *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar12);
            Name.Storage.field_0.value.Value.data = (uint8_t *)__s;
            raw_ostream::operator<<(OS,(format_object_base *)local_88);
            goto LAB_00d72c85;
          }
          pcVar5 = OS->OutBufCur;
          if (pcVar5 < OS->OutBufEnd) {
            OS->OutBufCur = pcVar5 + 1;
            *pcVar5 = ' ';
          }
          else {
            OS = (raw_ostream *)
                 raw_ostream::write(OS,0x20,__buf,(ulong)CONCAT31((int3)(bVar2 - 0x70 >> 8),bVar13))
            ;
          }
          sVar8 = strlen(__s);
          goto LAB_00d72c80;
        }
      }
    }
    uVar9 = 1;
    lVar12 = 0;
    this_00 = (DWARFUnit *)Die.Die;
    do {
      EVar3 = (this->Desc).Op[lVar12];
      if (EVar3 == SizeNA) break;
      if (EVar3 == BaseTypeRef && this_00 != (DWARFUnit *)0x0) {
        _local_a0 = DWARFUnit::getDIEForOffset
                              (this_00,this->Operands[lVar12] + (this_00->Header).Offset);
        if (((local_a0._8_8_ == (DWARFDebugInfoEntry *)0x0 || local_a0 == (DWARFUnit *)0x0) ||
            (pDVar4 = (local_a0._8_8_)->AbbrevDecl, pDVar4 == (DWARFAbbreviationDeclaration *)0x0))
           || (pDVar4->Tag != DW_TAG_base_type)) {
          Name.Storage.field_0._0_8_ = anon_var_dwarf_41e27b4;
          local_88 = (undefined1  [8])&PTR_home_01077fc8;
          Name.Storage.field_0.value.Value.field_0 =
               *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar12);
          goto LAB_00d72f9e;
        }
        Name.Storage.field_0.value.Value.field_0 =
             (anon_union_8_3_82d75f4a_for_ValueType_0)
             (this->Operands[lVar12] + (this_00->Header).Offset);
        Name.Storage.field_0._0_8_ = anon_var_dwarf_41e276f;
        local_88 = (undefined1  [8])&PTR_home_01077fc8;
        raw_ostream::operator<<(OS,(format_object_base *)local_88);
        DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_88,(DWARFDie *)local_a0,DW_AT_name);
        if (Name.Storage.field_0._40_1_ == '\x01') {
          SVar14.Length = 2;
          SVar14.Data = " \"";
          OS_00 = raw_ostream::operator<<(OS,SVar14);
          if (Name.Storage.field_0._40_1_ == '\0') {
            __assert_fail("hasVal",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                          ,0xad,
                          "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue>::getValue() & [T = llvm::DWARFFormValue]"
                         );
          }
          OVar15 = DWARFFormValue::getAsCString((DWARFFormValue *)local_88);
          if (((undefined1  [16])OVar15.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            llvm::operator<<(OS_00,None);
          }
          else {
            raw_ostream::operator<<(OS_00,OVar15.Storage.field_0.value);
          }
          Str_00.Length = 1;
          Str_00.Data = "\"";
          raw_ostream::operator<<(OS_00,Str_00);
        }
      }
      else if (EVar3 == SizeBlock) {
        local_a0 = (undefined1  [8])this->Operands[lVar12];
        uVar10 = (int)lVar12 - 1;
        this_00 = (DWARFUnit *)Die.Die;
        Name.Storage._52_4_ = uVar9;
        if (this->Operands[uVar10] != 0) {
          uVar11 = 1;
          do {
            uVar6 = DataExtractor::getU8(&Expr->Data,(uint64_t *)local_a0,(Error *)0x0);
            Name.Storage.field_0._0_8_ = anon_var_dwarf_41e27bf;
            local_88 = (undefined1  [8])&PTR_home_010780f0;
            Name.Storage.field_0._8_1_ = uVar6;
            raw_ostream::operator<<(OS,(format_object_base *)local_88);
            bVar13 = uVar11 < this->Operands[uVar10];
            this_00 = (DWARFUnit *)Die.Die;
            uVar11 = (ulong)((int)uVar11 + 1);
            uVar9 = Name.Storage._52_4_;
          } while (bVar13);
        }
      }
      else {
        if ((char)EVar3 < '\0') {
          Name.Storage.field_0.value.Value.field_0 =
               *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar12);
          Name.Storage.field_0._0_8_ = anon_var_dwarf_4106395;
          local_88 = (undefined1  [8])&PTR_home_010784d0;
        }
        else {
          if ((this->Opcode == 0xa3) || (this->Opcode == 0xf3)) goto LAB_00d72faf;
          Name.Storage.field_0._0_8_ = (long)"cu + 0x%lx" + 4;
          local_88 = (undefined1  [8])&PTR_home_01077fc8;
          Name.Storage.field_0.value.Value.field_0 =
               *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar12);
        }
LAB_00d72f9e:
        raw_ostream::operator<<(OS,(format_object_base *)local_88);
      }
LAB_00d72faf:
      lVar12 = 1;
      uVar10 = uVar9 & 1;
      uVar9 = 0;
    } while (uVar10 != 0);
  }
LAB_00d72c85:
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool DWARFExpression::Operation::print(raw_ostream &OS,
                                       const DWARFExpression *Expr,
                                       const MCRegisterInfo *RegInfo,
                                       DWARFUnit *U,
                                       bool isEH) {
  if (Error) {
    OS << "<decoding error>";
    return false;
  }

  StringRef Name = OperationEncodingString(Opcode);
  assert(!Name.empty() && "DW_OP has no name!");
  OS << Name;

  if ((Opcode >= DW_OP_breg0 && Opcode <= DW_OP_breg31) ||
      (Opcode >= DW_OP_reg0 && Opcode <= DW_OP_reg31) ||
      Opcode == DW_OP_bregx || Opcode == DW_OP_regx)
    if (prettyPrintRegisterOp(OS, Opcode, Operands, RegInfo, isEH))
      return true;

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];
    unsigned Signed = Size & Operation::SignBit;

    if (Size == Operation::SizeNA)
      break;

    if (Size == Operation::BaseTypeRef && U) {
      auto Die = U->getDIEForOffset(U->getOffset() + Operands[Operand]);
      if (Die && Die.getTag() == dwarf::DW_TAG_base_type) {
        OS << format(" (0x%08" PRIx64 ")", U->getOffset() + Operands[Operand]);
        if (auto Name = Die.find(dwarf::DW_AT_name))
          OS << " \"" << Name->getAsCString() << "\"";
      } else {
        OS << format(" <invalid base_type ref: 0x%" PRIx64 ">",
                     Operands[Operand]);
      }
    } else if (Size == Operation::SizeBlock) {
      uint64_t Offset = Operands[Operand];
      for (unsigned i = 0; i < Operands[Operand - 1]; ++i)
        OS << format(" 0x%02x", Expr->Data.getU8(&Offset));
    } else {
      if (Signed)
        OS << format(" %+" PRId64, (int64_t)Operands[Operand]);
      else if (Opcode != DW_OP_entry_value &&
               Opcode != DW_OP_GNU_entry_value)
        OS << format(" 0x%" PRIx64, Operands[Operand]);
    }
  }
  return true;
}